

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O0

bool NES_FDS_Read(void *chip,UINT16 adr,UINT8 *val)

{
  NES_FDS *fds;
  UINT8 *val_local;
  UINT16 adr_local;
  void *chip_local;
  
  if ((adr < 0x4040) || (0x407e < adr)) {
    if (adr == 0x4090) {
      *val = (byte)*(undefined4 *)((long)chip + 0x26c) | 0x40;
      chip_local._7_1_ = true;
    }
    else if (adr == 0x4092) {
      *val = (byte)*(undefined4 *)((long)chip + 0x268) | 0x40;
      chip_local._7_1_ = true;
    }
    else {
      chip_local._7_1_ = false;
    }
  }
  else {
    *val = (UINT8)*(undefined4 *)((long)chip + (long)(int)(adr - 0x4040) * 4 + 0x138);
    chip_local._7_1_ = true;
  }
  return chip_local._7_1_;
}

Assistant:

bool NES_FDS_Read(void* chip, UINT16 adr, UINT8* val)
{
	NES_FDS* fds = (NES_FDS*)chip;

	if (adr >= 0x4040 && adr < 0x407F)
	{
		// TODO: if wav_write is not enabled, the
		// read address may not be reliable? need
		// to test this on hardware.
		*val = (UINT8)fds->wave[TWAV][adr - 0x4040];
		return true;
	}

	if (adr == 0x4090)	// $4090 read volume envelope
	{
		*val = (UINT8)fds->env_out[EVOL] | 0x40;
		return true;
	}

	if (adr == 0x4092)	// $4092 read mod envelope
	{
		*val = (UINT8)fds->env_out[EMOD] | 0x40;
		return true;
	}

	return false;
}